

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall
helics::apps::Connector::establishPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  value_t vVar1;
  size_t sVar2;
  pointer pbVar3;
  element_type *peVar4;
  _func_int *p_Var5;
  _Elt_pointer pbVar6;
  json_value jVar7;
  int iVar8;
  iterator iVar9;
  undefined8 uVar10;
  reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uInp;
  pointer pbVar12;
  Connector *pCVar13;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_R8;
  Federate *pFVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar15;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *potentials;
  _Elt_pointer possibleFed;
  string_view target;
  format_args args;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  string_view fmt;
  string_view message;
  string_view commandStr;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  json establishInterfaces;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [2];
  pointer local_d0;
  data local_c8;
  ConnectionsList *local_b8;
  data local_b0;
  Connector *local_a0;
  _Map_pointer local_98;
  string local_90;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_70;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_68;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_60;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_58;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_50;
  uint64_t local_48 [3];
  
  scanPotentialInterfaces(this,possibleConnections);
  scanPotentialInterfaceTemplates(this,possibleConnections);
  local_a0 = this;
  scanUnconnectedInterfaces(this,possibleConnections);
  pbVar12 = (possibleConnections->unknownInputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (possibleConnections->unknownInputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != local_d0) {
    do {
      local_100._8_8_ = (pbVar12->_M_dataplus)._M_p;
      local_100._0_8_ = pbVar12->_M_string_length;
      iVar9 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialInputs)._M_h,(key_type *)local_100);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_00._M_str = (char *)possibleConnections;
      target_00._M_len = (size_t)(pbVar12->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_100,(apps *)pbVar12->_M_string_length,target_00,in_R8);
      for (uVar10 = local_f0[0]._8_8_;
          (_Rb_tree_node_base *)uVar10 != (_Rb_tree_node_base *)(local_100 + 8);
          uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10)) {
        sVar2 = *(size_t *)(uVar10 + 0x20);
        if (((sVar2 != pbVar12->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar8 = bcmp(((_Rb_tree_node_base *)(uVar10 + 0x20))->_M_parent,
                           (pbVar12->_M_dataplus)._M_p,sVar2), iVar8 != 0)))) &&
           (iVar9 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialInputs)._M_h,(key_type *)(uVar10 + 0x20))
           , iVar9.
             super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
             ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar9.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      CLI::std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_100);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != local_d0);
  }
  pbVar12 = (possibleConnections->unknownPubs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (possibleConnections->unknownPubs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != local_d0) {
    do {
      local_100._8_8_ = (pbVar12->_M_dataplus)._M_p;
      local_100._0_8_ = pbVar12->_M_string_length;
      iVar9 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialPubs)._M_h,(key_type *)local_100);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_01._M_str = (char *)possibleConnections;
      target_01._M_len = (size_t)(pbVar12->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_100,(apps *)pbVar12->_M_string_length,target_01,in_R8);
      for (uVar10 = local_f0[0]._8_8_;
          (_Rb_tree_node_base *)uVar10 != (_Rb_tree_node_base *)(local_100 + 8);
          uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10)) {
        sVar2 = *(size_t *)(uVar10 + 0x20);
        if (((sVar2 != pbVar12->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar8 = bcmp(((_Rb_tree_node_base *)(uVar10 + 0x20))->_M_parent,
                           (pbVar12->_M_dataplus)._M_p,sVar2), iVar8 != 0)))) &&
           (iVar9 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialPubs)._M_h,(key_type *)(uVar10 + 0x20)),
           iVar9.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
           ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar9.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      CLI::std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_100);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != local_d0);
  }
  pbVar12 = (possibleConnections->unknownEndpoints).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (possibleConnections->unknownEndpoints).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = possibleConnections;
  if (pbVar12 != pbVar3) {
    do {
      local_100._8_8_ = (pbVar12->_M_dataplus)._M_p;
      local_100._0_8_ = pbVar12->_M_string_length;
      iVar9 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialEndpoints)._M_h,(key_type *)local_100);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_02._M_str = (char *)local_b8;
      target_02._M_len = (size_t)(pbVar12->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_100,(apps *)pbVar12->_M_string_length,target_02,in_R8);
      for (uVar10 = local_f0[0]._8_8_;
          (_Rb_tree_node_base *)uVar10 != (_Rb_tree_node_base *)(local_100 + 8);
          uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10)) {
        sVar2 = *(size_t *)(uVar10 + 0x20);
        if (((sVar2 != pbVar12->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar8 = bcmp(((_Rb_tree_node_base *)(uVar10 + 0x20))->_M_parent,
                           (pbVar12->_M_dataplus)._M_p,sVar2), iVar8 != 0)))) &&
           (iVar9 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialEndpoints)._M_h,
                           (key_type *)(uVar10 + 0x20)),
           iVar9.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
           ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar9.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      CLI::std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_100);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar3);
  }
  pCVar13 = local_a0;
  peVar4 = (local_a0->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (peVar4->super_ValueFederate)._vptr_ValueFederate[-3];
  iVar8 = (**(code **)(*(long *)((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var5) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate + (long)p_Var5),0x10f
                    );
  possibleFed = (local_b8->federatesWithPotentialInterfaces).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar6 = (local_b8->federatesWithPotentialInterfaces).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (possibleFed != pbVar6) {
    local_d0 = (local_b8->federatesWithPotentialInterfaces).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98 = (local_b8->federatesWithPotentialInterfaces).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_50 = &local_b8->potentialInputs;
    local_58 = &local_b8->potentialPubs;
    local_60 = &local_b8->potentialEndpoints;
    local_68 = &local_b8->potentialPublicationTemplates;
    local_70 = &local_b8->potentialInputTemplates;
    potentials = &local_b8->potentialEndpointTemplates;
    do {
      local_c8.m_type = null;
      local_c8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_char_(&)[20],_char[20],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_b0,(char (*) [20])"register_interfaces");
      pvVar11 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_c8,"command");
      vVar1 = (pvVar11->m_data).m_type;
      (pvVar11->m_data).m_type = local_b0.m_type;
      jVar7 = (pvVar11->m_data).m_value;
      (pvVar11->m_data).m_value = local_b0.m_value;
      local_b0.m_type = vVar1;
      local_b0.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"inputs","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_c8,local_50,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"publications","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_c8,local_58,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"endpoints","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_c8,local_60,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"templated_publications","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_c8,local_68,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"templated_inputs","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_c8,local_70,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"templated_endpoints","");
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pFVar14 = (Federate *)0x0;
      }
      else {
        pFVar14 = (Federate *)
                  ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_c8,potentials,possibleFed,iVar8,(string *)local_100,pFVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      fileops::generateJsonString((string *)local_100,(json *)&local_c8,true);
      peVar4 = (pCVar13->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      aVar15.values_ = (value<fmt::v11::context> *)0x0;
      target._M_str = (possibleFed->_M_dataplus)._M_p;
      target._M_len = possibleFed->_M_string_length;
      commandStr._M_str = (char *)local_100._0_8_;
      commandStr._M_len = local_100._8_8_;
      Federate::sendCommand
                ((Federate *)
                 ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                 (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]),target,commandStr,
                 HELICS_SEQUENCING_MODE_FAST);
      if (5 < iVar8) {
        peVar4 = (pCVar13->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (peVar4->super_ValueFederate)._vptr_ValueFederate[-3];
        local_48[0] = pCVar13->interfacesRequested;
        args.field_1.values_ = aVar15.values_;
        args.desc_ = (unsigned_long_long)local_48;
        fmt.size_ = 4;
        fmt.data_ = (char *)0x17;
        ::fmt::v11::vformat_abi_cxx11_(&local_90,(v11 *)"{} interfaces requested",fmt,args);
        message._M_str = local_90._M_dataplus._M_p;
        message._M_len = local_90._M_string_length;
        Federate::logMessage
                  ((Federate *)
                   ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate + (long)p_Var5),6,
                   message);
        pCVar13 = local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_c8);
      possibleFed = possibleFed + 1;
      if (possibleFed == local_d0) {
        possibleFed = local_98[1];
        local_98 = local_98 + 1;
        local_d0 = possibleFed + 0x10;
      }
    } while (possibleFed != pbVar6);
  }
  return;
}

Assistant:

void Connector::establishPotentialInterfaces(ConnectionsList& possibleConnections)
{
    scanPotentialInterfaces(possibleConnections);
    scanPotentialInterfaceTemplates(possibleConnections);

    /** now try to match unconnected interfaces to some of the potential ones*/
    scanUnconnectedInterfaces(possibleConnections);
    /** check for unknown interface connections to potential interfaces*/
    scanUnknownInterfaces(possibleConnections);

    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    for (auto& possibleFed : possibleConnections.federatesWithPotentialInterfaces) {
        nlohmann::json establishInterfaces;
        establishInterfaces["command"] = "register_interfaces";
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialInputs,
                                           possibleFed,
                                           logLevel,
                                           "inputs",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialPubs,
                                           possibleFed,
                                           logLevel,
                                           "publications",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialEndpoints,
                                           possibleFed,
                                           logLevel,
                                           "endpoints",
                                           fed.get());

        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialPublicationTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_publications",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialInputTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_inputs",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialEndpointTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_endpoints",
                                           fed.get());
        const std::string commandStr = fileops::generateJsonString(establishInterfaces);
        fed->sendCommand(possibleFed, commandStr);
        if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
            fed->logInfoMessage(fmt::format("{} interfaces requested", interfacesRequested));
        }
    }
}